

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTcSymMetaclass::gen_code_new
          (CTcSymMetaclass *this,int discard,int argc,int varargs,CTcNamedArgs *named_args,
          int is_transient)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  size_t __n;
  void *__buf;
  void *__buf_00;
  CTcGenTarg *pCVar3;
  
  __n = CONCAT44(in_register_0000000c,varargs);
  if (((this->super_CTcSymMetaclassBase).field_0x58 & 1) == 0) {
    if (varargs != 0) {
      CTcGenTarg::write_op(G_cg,'v');
    }
    if ((argc < 0x100) && ((this->super_CTcSymMetaclassBase).meta_idx_ < 0x100)) {
      CTcGenTarg::write_op(G_cg,(is_transient != 0) * '\x02' + 0xc0);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)argc,__buf,__n);
      pCVar3 = (CTcGenTarg *)G_cs;
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(char)(this->super_CTcSymMetaclassBase).meta_idx_,
                 __buf_00,__n);
    }
    else {
      CTcGenTarg::write_op(G_cg,0xc2 - (is_transient == 0));
      CTcDataStream::write2(&G_cs->super_CTcDataStream,argc);
      pCVar3 = (CTcGenTarg *)G_cs;
      CTcDataStream::write2(&G_cs->super_CTcDataStream,(this->super_CTcSymMetaclassBase).meta_idx_);
    }
    G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
    CTcGenTarg::post_call_cleanup(pCVar3,named_args);
    if (discard == 0) {
      CTcGenTarg::write_op(G_cg,0x8b);
      pCVar3 = G_cg;
      iVar2 = G_cg->sp_depth_;
      iVar1 = iVar2 + 1;
      G_cg->sp_depth_ = iVar1;
      if (pCVar3->max_sp_depth_ <= iVar2) {
        pCVar3->max_sp_depth_ = iVar1;
      }
    }
    return;
  }
  CTcTokenizer::log_error
            (0x2d2d,(ulong)(uint)(this->super_CTcSymMetaclassBase).super_CTcSymbol.
                                 super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_,
             (this->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase.
             super_CVmHashEntryCS.super_CVmHashEntry.str_);
  return;
}

Assistant:

void CTcSymMetaclass::gen_code_new(int discard, int argc,
                                   int varargs, CTcNamedArgs *named_args,
                                   int is_transient)
{
    /* if this is an external metaclass, we can't generate code */
    if (ext_)
    {
        G_tok->log_error(TCERR_EXT_METACLASS, (int)get_sym_len(), get_sym());
        return;
    }

    /* if we have varargs, write the modifier */
    if (varargs)
        G_cg->write_op(OPC_VARARGC);
    
    if (meta_idx_ <= 255 && argc <= 255)
    {
        G_cg->write_op(is_transient ? OPC_TRNEW1 : OPC_NEW1);
        G_cs->write((char)argc);
        G_cs->write((char)meta_idx_);
    }
    else
    {
        G_cg->write_op(is_transient ? OPC_TRNEW1 : OPC_NEW2);
        G_cs->write2(argc);
        G_cs->write2(meta_idx_);
    }

    /* new1/new2 remove arguments */
    G_cg->note_pop(argc);

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if we're not discarding the value, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}